

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

QString * __thiscall QDir::filePath(QDir *this,QString *fileName)

{
  bool bVar1;
  QString *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_char16_t> QVar2;
  QDirPrivate *d;
  QString ret;
  QStringBuilder<QStringBuilder<QString_&,_char16_t>,_const_QString_&> *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  undefined2 in_stack_ffffffffffffff16;
  QFileSystemEntry *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff28;
  QChar c;
  QChar local_4a;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  QString *local_30;
  char16_t local_28;
  long local_8;
  
  c.ucs = (char16_t)((ulong)in_stack_ffffffffffffff28 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = treatAsAbsolute(in_RSI);
  if (bVar1) {
    QString::QString((QString *)
                     CONCAT26(in_stack_ffffffffffffff16,
                              CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                     (QString *)in_stack_ffffffffffffff08);
    goto LAB_0027d77b;
  }
  d_func((QDir *)0x27d590);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::filePath(in_stack_ffffffffffffff18);
  bVar1 = QString::isEmpty((QString *)0x27d5e2);
  if (bVar1) {
    QString::QString((QString *)
                     CONCAT26(in_stack_ffffffffffffff16,
                              CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
                     (QString *)in_stack_ffffffffffffff08);
  }
  else {
    bVar1 = QString::isEmpty((QString *)0x27d614);
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(&local_4a,L'/');
      bVar1 = QString::endsWith(&in_stack_ffffffffffffff18->m_filePath,c,
                                CONCAT22(in_stack_ffffffffffffff16,in_stack_ffffffffffffff14));
      if (!bVar1) {
        QVar2 = ::operator%(&in_stack_ffffffffffffff18->m_filePath,
                            (char16_t *)
                            CONCAT26(in_stack_ffffffffffffff16,
                                     CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)))
        ;
        local_30 = QVar2.a;
        local_28 = QVar2.b;
        ::operator%((QStringBuilder<QString_&,_char16_t> *)
                    CONCAT26(local_28,CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))
                    ,(QString *)in_stack_ffffffffffffff08);
        ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff08);
        goto LAB_0027d76e;
      }
    }
    ::operator%(&in_stack_ffffffffffffff18->m_filePath,
                (QString *)
                CONCAT26(in_stack_ffffffffffffff16,
                         CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QString_&,_const_QString_&> *)in_stack_ffffffffffffff08);
  }
LAB_0027d76e:
  QString::~QString((QString *)0x27d77b);
LAB_0027d77b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QDir::filePath(const QString &fileName) const
{
    if (treatAsAbsolute(fileName))
        return fileName;

    Q_D(const QDir);
    QString ret = d->dirEntry.filePath();
    if (fileName.isEmpty())
        return ret;

#ifdef Q_OS_WIN
    if (fileName.startsWith(u'/') || fileName.startsWith(u'\\')) {
        // Handle the "absolute except for drive" case (i.e. \blah not c:\blah):
        const qsizetype drive = drivePrefixLength(ret);
        return drive > 0 ? QStringView{ret}.left(drive) % fileName : fileName;
    }
#endif // Q_OS_WIN

    if (ret.isEmpty() || ret.endsWith(u'/'))
        return ret % fileName;
    return ret % u'/' % fileName;
}